

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_nonce_process
              (secp256k1_context *ctx,secp256k1_musig_session *session,
              secp256k1_musig_aggnonce *aggnonce,uchar *msg32,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  secp256k1_scalar *r;
  secp256k1_scalar *e;
  int iVar1;
  long lVar2;
  secp256k1_ge *psVar3;
  void *pvVar4;
  secp256k1_ge *psVar5;
  char *pcVar6;
  byte bVar7;
  uchar fin_nonce [32];
  uchar agg_pk32 [32];
  secp256k1_ge fin_nonce_pt;
  secp256k1_scalar e_tmp;
  secp256k1_musig_session_internal session_i;
  uchar noncehash [32];
  secp256k1_ge aggnonce_pts [2];
  secp256k1_keyagg_cache_internal cache_i;
  
  bVar7 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x273,"test condition failed: ctx != NULL");
    abort();
  }
  if (session == (secp256k1_musig_session *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "session != NULL";
  }
  else if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "aggnonce != NULL";
  }
  else if (msg32 == (uchar *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "msg32 != NULL";
  }
  else {
    if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
      iVar1 = secp256k1_keyagg_cache_load(ctx,&cache_i,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_get_b32(agg_pk32,(secp256k1_fe *)&cache_i);
      iVar1 = secp256k1_musig_aggnonce_load(ctx,aggnonce_pts,aggnonce);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_musig_compute_noncehash_sha256_tagged((secp256k1_sha256 *)&e_tmp);
      for (lVar2 = 0; lVar2 != 0xd0; lVar2 = lVar2 + 0x68) {
        secp256k1_musig_ge_serialize_ext
                  ((uchar *)&fin_nonce_pt,(secp256k1_ge *)((long)aggnonce_pts[0].x.n + lVar2));
        secp256k1_sha256_write((secp256k1_sha256 *)&e_tmp,(uchar *)&fin_nonce_pt,0x21);
      }
      r = &session_i.noncecoef;
      secp256k1_sha256_write((secp256k1_sha256 *)&e_tmp,agg_pk32,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&e_tmp,msg32,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&e_tmp,noncehash);
      secp256k1_scalar_set_b32(r,noncehash,(int *)0x0);
      secp256k1_effective_nonce((secp256k1_gej *)&e_tmp,aggnonce_pts,r);
      secp256k1_ge_set_gej(&fin_nonce_pt,(secp256k1_gej *)&e_tmp);
      iVar1 = secp256k1_ge_is_infinity(&fin_nonce_pt);
      if (iVar1 != 0) {
        psVar3 = &secp256k1_ge_const_g;
        psVar5 = &fin_nonce_pt;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          (psVar5->x).n[0] = (psVar3->x).n[0];
          psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar7 * -2 + 1) * 8);
          psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar7 * -0x10 + 8);
        }
      }
      secp256k1_fe_normalize_var(&fin_nonce_pt.x);
      secp256k1_fe_get_b32(fin_nonce,&fin_nonce_pt.x);
      secp256k1_fe_normalize_var(&fin_nonce_pt.y);
      session_i.fin_nonce_parity = secp256k1_fe_is_odd(&fin_nonce_pt.y);
      e = &session_i.challenge;
      secp256k1_schnorrsig_challenge(e,fin_nonce,msg32,0x20,agg_pk32);
      secp256k1_scalar_set_int(&session_i.s_part,0);
      iVar1 = secp256k1_scalar_is_zero(&cache_i.tweak);
      if (iVar1 == 0) {
        secp256k1_scalar_mul(&e_tmp,e,&cache_i.tweak);
        iVar1 = secp256k1_fe_is_odd(&cache_i.pk.y);
        if (iVar1 != 0) {
          secp256k1_scalar_negate(&e_tmp,&e_tmp);
        }
        session_i.s_part.d[2] = e_tmp.d[2];
        session_i.s_part.d[3] = e_tmp.d[3];
        session_i.s_part.d[0] = e_tmp.d[0];
        session_i.s_part.d[1] = e_tmp.d[1];
      }
      session_i.fin_nonce[0x10] = fin_nonce[0x10];
      session_i.fin_nonce[0x11] = fin_nonce[0x11];
      session_i.fin_nonce[0x12] = fin_nonce[0x12];
      session_i.fin_nonce[0x13] = fin_nonce[0x13];
      session_i.fin_nonce[0x14] = fin_nonce[0x14];
      session_i.fin_nonce[0x15] = fin_nonce[0x15];
      session_i.fin_nonce[0x16] = fin_nonce[0x16];
      session_i.fin_nonce[0x17] = fin_nonce[0x17];
      session_i.fin_nonce[0x18] = fin_nonce[0x18];
      session_i.fin_nonce[0x19] = fin_nonce[0x19];
      session_i.fin_nonce[0x1a] = fin_nonce[0x1a];
      session_i.fin_nonce[0x1b] = fin_nonce[0x1b];
      session_i.fin_nonce[0x1c] = fin_nonce[0x1c];
      session_i.fin_nonce[0x1d] = fin_nonce[0x1d];
      session_i.fin_nonce[0x1e] = fin_nonce[0x1e];
      session_i.fin_nonce[0x1f] = fin_nonce[0x1f];
      session_i.fin_nonce[0] = fin_nonce[0];
      session_i.fin_nonce[1] = fin_nonce[1];
      session_i.fin_nonce[2] = fin_nonce[2];
      session_i.fin_nonce[3] = fin_nonce[3];
      session_i.fin_nonce[4] = fin_nonce[4];
      session_i.fin_nonce[5] = fin_nonce[5];
      session_i.fin_nonce[6] = fin_nonce[6];
      session_i.fin_nonce[7] = fin_nonce[7];
      session_i.fin_nonce[8] = fin_nonce[8];
      session_i.fin_nonce[9] = fin_nonce[9];
      session_i.fin_nonce[10] = fin_nonce[10];
      session_i.fin_nonce[0xb] = fin_nonce[0xb];
      session_i.fin_nonce[0xc] = fin_nonce[0xc];
      session_i.fin_nonce[0xd] = fin_nonce[0xd];
      session_i.fin_nonce[0xe] = fin_nonce[0xe];
      session_i.fin_nonce[0xf] = fin_nonce[0xf];
      session->data[0] = 0x9d;
      session->data[1] = 0xed;
      session->data[2] = 0xe9;
      session->data[3] = '\x17';
      session->data[4] = (uchar)session_i.fin_nonce_parity;
      *(undefined8 *)(session->data + 5) = fin_nonce._0_8_;
      *(undefined8 *)(session->data + 0xd) = fin_nonce._8_8_;
      *(undefined8 *)(session->data + 0x15) = fin_nonce._16_8_;
      *(undefined8 *)(session->data + 0x1d) = fin_nonce._24_8_;
      secp256k1_scalar_get_b32(session->data + 0x25,r);
      secp256k1_scalar_get_b32(session->data + 0x45,e);
      secp256k1_scalar_get_b32(session->data + 0x65,&session_i.s_part);
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "keyagg_cache != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar6,pvVar4);
  return 0;
}

Assistant:

int secp256k1_musig_nonce_process(const secp256k1_context* ctx, secp256k1_musig_session *session, const secp256k1_musig_aggnonce  *aggnonce, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_ge aggnonce_pts[2];
    unsigned char fin_nonce[32];
    secp256k1_musig_session_internal session_i;
    unsigned char agg_pk32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_fe_get_b32(agg_pk32, &cache_i.pk.x);

    if (!secp256k1_musig_aggnonce_load(ctx, aggnonce_pts, aggnonce)) {
        return 0;
    }

    secp256k1_musig_nonce_process_internal(&session_i.fin_nonce_parity, fin_nonce, &session_i.noncecoef, aggnonce_pts, agg_pk32, msg32);
    secp256k1_schnorrsig_challenge(&session_i.challenge, fin_nonce, msg32, 32, agg_pk32);

    /* If there is a tweak then set `challenge` times `tweak` to the `s`-part.*/
    secp256k1_scalar_set_int(&session_i.s_part, 0);
    if (!secp256k1_scalar_is_zero(&cache_i.tweak)) {
        secp256k1_scalar e_tmp;
        secp256k1_scalar_mul(&e_tmp, &session_i.challenge, &cache_i.tweak);
        if (secp256k1_fe_is_odd(&cache_i.pk.y)) {
            secp256k1_scalar_negate(&e_tmp, &e_tmp);
        }
        session_i.s_part = e_tmp;
    }
    memcpy(session_i.fin_nonce, fin_nonce, sizeof(session_i.fin_nonce));
    secp256k1_musig_session_save(session, &session_i);
    return 1;
}